

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::ShaderSubroutine::APITest1::iterate(APITest1 *this)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  size_t sVar7;
  long lVar8;
  NotSupportedError *this_00;
  undefined8 in_RCX;
  undefined8 uVar9;
  char *pcVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  double dVar14;
  GLboolean bool_value;
  GLint int_value;
  GLfloat float_value;
  GLdouble double_value;
  GLint64 int64_value;
  char local_1e5;
  int local_1e4;
  char local_1dd;
  float local_1dc;
  char *local_1d8;
  double local_1d0;
  uint local_1c8;
  int local_1c4;
  long local_1c0;
  long local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b8 = CONCAT44(extraout_var,iVar5);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar4) {
    uVar9 = CONCAT71((int7)((ulong)in_RCX >> 8),1);
    lVar8 = 0;
    do {
      lVar3 = local_1b8;
      local_1c8 = (uint)uVar9;
      local_1e5 = '\0';
      local_1d0 = 0.0;
      local_1dc = 0.0;
      local_1e4 = 0;
      local_1c0 = 0;
      local_1c4 = (&DAT_020d8840)[lVar8 * 6];
      local_1d8 = (&PTR_anon_var_dwarf_451981_020d8838)[lVar8 * 3];
      uVar1 = (&DAT_020d8830)[lVar8 * 6];
      (**(code **)(local_1b8 + 0x798))(uVar1,&local_1e5);
      dVar6 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar6,"glGetBooleanv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6b9);
      (**(code **)(lVar3 + 0x7f8))(uVar1,&local_1d0);
      dVar6 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar6,"glGetDoublev() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6bc);
      (**(code **)(lVar3 + 0x818))(uVar1,&local_1dc);
      dVar6 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar6,"glGetFloatv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6bf);
      (**(code **)(lVar3 + 0x868))(uVar1,&local_1e4);
      dVar6 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar6,"glGetIntegerv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6c2);
      (**(code **)(lVar3 + 0x850))(uVar1,&local_1c0);
      dVar6 = (**(code **)(lVar3 + 0x800))();
      iVar2 = local_1c4;
      glu::checkError(dVar6,"glGetInteger64v() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6c5);
      iVar5 = (int)(ostringstream *)&local_1a8;
      if (local_1e4 < iVar2) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"GL implementation reports a value of [",0x26);
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1e4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] for property [",0x10);
        pcVar10 = local_1d8;
        if (local_1d8 == (char *)0x0) {
          std::ios::clear(iVar5 + (int)local_1a8[-3]);
        }
        else {
          sVar7 = strlen(local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"], whereas the min max for the property is [",0x2c);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"].",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        this->m_has_test_passed = false;
      }
      if ((local_1e4 == 0 && local_1e5 == '\x01') || (local_1e5 != '\x01' && local_1e4 != 0)) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Invalid boolean value [",0x17);
        local_1dd = local_1e5;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,&local_1dd,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] reported for property [",0x19);
        pcVar10 = local_1d8;
        if (local_1d8 == (char *)0x0) {
          std::ios::clear(iVar5 + (int)local_1a8[-3]);
        }
        else {
          sVar7 = strlen(local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] (int value:[",0xe);
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1e4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"])",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        this->m_has_test_passed = false;
      }
      dVar12 = local_1d0 - (double)local_1e4;
      dVar14 = -dVar12;
      if (-dVar12 <= dVar12) {
        dVar14 = dVar12;
      }
      if (9.999999747378752e-06 < dVar14) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Invalid double value [",0x16);
        std::ostream::_M_insert<double>(local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] reported for property [",0x19);
        pcVar10 = local_1d8;
        if (local_1d8 == (char *)0x0) {
          std::ios::clear(iVar5 + (int)local_1a8[-3]);
        }
        else {
          sVar7 = strlen(local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] (int value:[",0xe);
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1e4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"])",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        this->m_has_test_passed = false;
      }
      fVar13 = local_1dc - (float)local_1e4;
      fVar11 = -fVar13;
      if (-fVar13 <= fVar13) {
        fVar11 = fVar13;
      }
      if (1e-05 < fVar11) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Invalid float value [",0x15);
        std::ostream::_M_insert<double>((double)local_1dc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] reported for property [",0x19);
        pcVar10 = local_1d8;
        if (local_1d8 == (char *)0x0) {
          std::ios::clear(iVar5 + (int)local_1a8[-3]);
        }
        else {
          sVar7 = strlen(local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] (int value:[",0xe);
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1e4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"])",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        this->m_has_test_passed = false;
      }
      if (local_1c0 != local_1e4) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Invalid 64-bit integer value [",0x1e);
        std::ostream::_M_insert<double>((double)local_1dc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] reported for property [",0x19);
        pcVar10 = local_1d8;
        if (local_1d8 == (char *)0x0) {
          std::ios::clear(iVar5 + (int)local_1a8[-3]);
        }
        else {
          sVar7 = strlen(local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] (int value:[",0xe);
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1e4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"])",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        this->m_has_test_passed = false;
      }
      lVar8 = 1;
      uVar9 = 0;
    } while ((local_1c8 & 1) != 0);
    bVar4 = this->m_has_test_passed == false;
    if (bVar4) {
      pcVar10 = "Fail";
    }
    else {
      pcVar10 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar4,pcVar10);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"GL_ARB_shader_subroutine is not supported.","");
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b0);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult APITest1::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Iterate over all pnames */
	const struct
	{
		glw::GLenum pname;
		const char* pname_string;
		glw::GLint  min_value;
	} pnames[] = { { GL_MAX_SUBROUTINES, "GL_MAX_SUBROUTINES", 256 },
				   { GL_MAX_SUBROUTINE_UNIFORM_LOCATIONS, "GL_MAX_SUBROUTINE_UNIFORM_LOCATIONS", 1024 } };
	const unsigned int n_pnames = sizeof(pnames) / sizeof(pnames[0]);

	for (unsigned int n_pname = 0; n_pname < n_pnames; ++n_pname)
	{
		glw::GLboolean	 bool_value   = GL_FALSE;
		glw::GLdouble	  double_value = 0.0;
		glw::GLfloat	   float_value  = 0.0f;
		glw::GLint		   int_value	= 0;
		glw::GLint64	   int64_value  = 0;
		const glw::GLint   min_value	= pnames[n_pname].min_value;
		const glw::GLenum& pname		= pnames[n_pname].pname;
		const char*		   pname_string = pnames[n_pname].pname_string;

		/* Retrieve the pname values */
		gl.getBooleanv(pname, &bool_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() call failed.");

		gl.getDoublev(pname, &double_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetDoublev() call failed.");

		gl.getFloatv(pname, &float_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() call failed.");

		gl.getIntegerv(pname, &int_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed.");

		gl.getInteger64v(pname, &int64_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInteger64v() call failed.");

		/* Make sure the value reported meets the min max requirement */
		if (int_value < min_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "GL implementation reports a value of [" << int_value
							   << "]"
								  " for property ["
							   << pname_string << "]"
												  ", whereas the min max for the property is ["
							   << min_value << "]." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		/* Verify the other getters reported valid values */
		const float epsilon = 1e-5f;

		if (((int_value == 0) && (bool_value == GL_TRUE)) || ((int_value != 0) && (bool_value != GL_TRUE)))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid boolean value [" << bool_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		if (de::abs(double_value - (double)int_value) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid double value [" << double_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		if (de::abs(float_value - (float)int_value) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid float value [" << float_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		if (int64_value != int_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid 64-bit integer value [" << float_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	} /* for (all pnames) */

	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}